

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyInfoParser.cpp
# Opt level: O0

void __thiscall llbuild::core::DependencyInfoParser::parse(DependencyInfoParser *this)

{
  char *pcVar1;
  char cVar2;
  iterator pcVar3;
  char *pcVar4;
  iterator pcVar5;
  bool local_131;
  char *local_f0;
  StringRef operand;
  char *operandEnd;
  char *operandStart;
  Opcode opcode;
  char *opcodeStart;
  char *end;
  char *cur;
  DependencyInfoParser *local_a0;
  DependencyInfoParser *this_local;
  char *local_90;
  size_t local_88;
  undefined8 local_80;
  char *local_78;
  char **local_70;
  char *local_68;
  char *local_60;
  char **local_58;
  DependencyInfoParser *local_50;
  char **local_48;
  DependencyInfoParser *local_40;
  DependencyInfoParser *local_38;
  DependencyInfoParser *local_30;
  size_t local_28;
  char *local_20;
  iterator local_18;
  int local_c;
  
  local_70 = &cur;
  local_78 = "";
  local_80 = 1;
  local_90 = "";
  local_88 = 1;
  local_131 = false;
  local_a0 = this;
  this_local = this;
  if ((this->data).Length != 0) {
    local_18 = llvm::StringRef::end(&this->data);
    local_18 = local_18 + -local_88;
    local_20 = local_90;
    local_28 = local_88;
    if (local_88 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_18,local_90,local_88);
    }
    local_131 = local_c == 0;
  }
  if ((bool)(local_131 ^ 1)) {
    local_50 = this;
    (*this->actions->_vptr_ParseActions[2])
              (this->actions,"missing null terminator",(this->data).Length);
  }
  else {
    cVar2 = llvm::StringRef::operator[](&this->data,0);
    if (cVar2 == '\0') {
      end = llvm::StringRef::begin(&this->data);
      pcVar3 = llvm::StringRef::end(&this->data);
      while (pcVar1 = end, end != pcVar3) {
        local_f0 = end + 1;
        cVar2 = *end;
        end = local_f0;
        while (*end != '\0') {
          end = end + 1;
          if (pcVar3 <= end) {
            __assert_fail("cur < end",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/DependencyInfoParser.cpp"
                          ,0x4f,"void llbuild::core::DependencyInfoParser::parse()");
          }
        }
        operand.Length = (size_t)end;
        if (*end != '\0' || pcVar3 <= end) {
          __assert_fail("*operandEnd == \'\\x00\' && cur < end",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/DependencyInfoParser.cpp"
                        ,0x52,"void llbuild::core::DependencyInfoParser::parse()");
        }
        pcVar4 = end + 1;
        operand.Data = end + -(long)local_f0;
        local_58 = &local_f0;
        local_48 = &local_f0;
        local_68 = operand.Data;
        local_60 = local_f0;
        if (operand.Data == (char *)0x0) {
          local_30 = this;
          (*this->actions->_vptr_ParseActions[2])
                    (this->actions,"empty operand",(long)pcVar1 - (long)(this->data).Data);
          return;
        }
        end = pcVar4;
        if (cVar2 == '\0') {
          pcVar5 = llvm::StringRef::begin(&this->data);
          if (pcVar1 == pcVar5) {
            (*this->actions->_vptr_ParseActions[3])(this->actions,local_f0,operand.Data);
          }
          else {
            local_38 = this;
            (*this->actions->_vptr_ParseActions[2])
                      (this->actions,"invalid duplicate version",
                       (long)pcVar1 - (long)(this->data).Data);
          }
        }
        else if (cVar2 == '\x10') {
          (*this->actions->_vptr_ParseActions[4])(this->actions,local_f0,operand.Data);
        }
        else if (cVar2 == '\x11') {
          (*this->actions->_vptr_ParseActions[6])(this->actions,local_f0,operand.Data);
        }
        else if (cVar2 == '@') {
          (*this->actions->_vptr_ParseActions[5])(this->actions,local_f0,operand.Data);
        }
        else {
          local_40 = this;
          (*this->actions->_vptr_ParseActions[2])
                    (this->actions,"unknown opcode in file",(long)pcVar1 - (long)(this->data).Data);
        }
      }
    }
    else {
      (*this->actions->_vptr_ParseActions[2])(this->actions,"missing version record",0);
    }
  }
  return;
}

Assistant:

void DependencyInfoParser::parse() {
  // Validate that the file ends with a null byte, if not it is malformed and we
  // just bail on parsing.
  if (!data.endswith(StringRef("\0", 1))) {
    actions.error("missing null terminator", data.size());
    return;
  }

  // Validate that the file starts with the version record.
  if (Opcode(data[0]) != Opcode::Version) {
    actions.error("missing version record", 0);
    return;
  }

  // Parse the records in turn.
  const char* cur = data.begin();
  const char* end = data.end();
  while (cur != end) {
    const char* opcodeStart = cur;
    auto opcode = Opcode(*cur++);
    const char* operandStart = cur;
    while (*cur != '\0') {
      ++cur;
      // We require the file have a terminating null, so we can never scan past
      // the end.
      assert (cur < end);
    }
    const char* operandEnd = cur;
    assert(*operandEnd == '\x00' && cur < end);
    ++cur;

    // Diagnose empty operands (missing isn't possible.
    auto operand = StringRef(operandStart, operandEnd - operandStart);
    if (operand.empty()) {
      actions.error("empty operand", opcodeStart - data.data());
      break;
    }

    // Handle the opcode.
    switch (opcode) {
    case Opcode::Version: {
      // Diagnose duplicate version records.
      if (opcodeStart != data.begin()) {
        actions.error("invalid duplicate version", opcodeStart - data.data());
        break;
      }
      actions.actOnVersion(operand);
      break;
    }

    case Opcode::Input: {
      actions.actOnInput(operand);
      break;
    }

    case Opcode::Missing: {
      actions.actOnMissing(operand);
      break;
    }

    case Opcode::Output: {
      actions.actOnOutput(operand);
      break;
    }

    default:
      actions.error("unknown opcode in file", opcodeStart - data.data());
      break;
    }
  }
}